

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpinfo.c
# Opt level: O0

void print_usage(FILE *stream,char *app)

{
  char *app_local;
  FILE *stream_local;
  
  fprintf((FILE *)stream,
          "usage:\n%s -h|--help : this help message\n%s -v|--version : print version\n%s [-vqo output] file1 [file2 ...]\n  -v, --version: print version before info\n  -q, --quiet:   no error/warning printed\n  -o, --output:  output filename\n"
          ,app,app,app);
  return;
}

Assistant:

static void print_usage(FILE* stream, const char* app)
{
	fprintf(
		stream,
		"usage:\n"
		"%s -h|--help : this help message\n"
		"%s -v|--version : print version\n"
		"%s [-vqo output] file1 [file2 ...]\n"
		"  -v, --version: print version before info\n"
		"  -q, --quiet:   no error/warning printed\n"
		"  -o, --output:  output filename\n", app, app, app);
}